

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapLib.c
# Opt level: O0

Amap_Lib_t * Amap_LibAlloc(void)

{
  Amap_Lib_t *__s;
  Vec_Ptr_t *pVVar1;
  Aig_MmFlex_t *pAVar2;
  Amap_Lib_t *p;
  
  __s = (Amap_Lib_t *)malloc(0xa0);
  memset(__s,0,0xa0);
  pVVar1 = Vec_PtrAlloc(100);
  __s->vGates = pVVar1;
  pAVar2 = Aig_MmFlexStart();
  __s->pMemGates = pAVar2;
  pAVar2 = Aig_MmFlexStart();
  __s->pMemSet = pAVar2;
  return __s;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Allocs a library.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Amap_Lib_t * Amap_LibAlloc()
{
    Amap_Lib_t * p;
    p = (Amap_Lib_t *)ABC_ALLOC( Amap_Lib_t, 1 );
    memset( p, 0, sizeof(Amap_Lib_t) );
    p->vGates = Vec_PtrAlloc( 100 );
    p->pMemGates = Aig_MmFlexStart();
    p->pMemSet = Aig_MmFlexStart();
    return p;
}